

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O2

void Assimp::IFC::ConvertDirection(IfcVector3 *out,IfcDirection *in)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  IfcVector3 *pIVar3;
  double dVar4;
  char *unaff_retaddr;
  
  out->z = 0.0;
  out->x = 0.0;
  out->y = 0.0;
  for (uVar2 = 0; lVar1 = *(long *)&(in->super_IfcGeometricRepresentationItem).field_0x30,
      uVar2 < (ulong)(*(long *)&in->field_0x38 - lVar1 >> 3); uVar2 = uVar2 + 1) {
    pIVar3 = (IfcVector3 *)&out->z;
    if (((int)uVar2 != 2) && (pIVar3 = out, (int)uVar2 == 1)) {
      pIVar3 = (IfcVector3 *)&out->y;
    }
    pIVar3->x = *(double *)(lVar1 + uVar2 * 8);
  }
  dVar4 = SQRT(out->z * out->z + out->x * out->x + out->y * out->y);
  if (1e-06 <= dVar4) {
    dVar4 = 1.0 / dVar4;
    out->x = dVar4 * out->x;
    out->y = dVar4 * out->y;
    out->z = dVar4 * out->z;
    return;
  }
  LogFunctions<Assimp::IFCImporter>::LogWarn(unaff_retaddr);
  return;
}

Assistant:

void ConvertDirection(IfcVector3& out, const Schema_2x3::IfcDirection& in)
{
    out = IfcVector3();
    for(size_t i = 0; i < in.DirectionRatios.size(); ++i) {
        out[static_cast<unsigned int>(i)] = in.DirectionRatios[i];
    }
    const IfcFloat len = out.Length();
    if (len<1e-6) {
        IFCImporter::LogWarn("direction vector magnitude too small, normalization would result in a division by zero");
        return;
    }
    out /= len;
}